

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioSourceVoice_SubmitSourceBuffer
                   (FAudioSourceVoice *voice,FAudioBuffer *pBuffer,FAudioBufferWMA *pBufferWMA)

{
  code *pcVar1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  long lVar5;
  long *in_RDX;
  long in_RSI;
  long *in_RDI;
  SDL_AssertState sdl_assert_state_1;
  FAudioXMA2WaveFormat *fmtex_1;
  FAudioADPCMWaveFormat *fmtex;
  SDL_AssertState sdl_assert_state;
  FAudioBufferEntry *list;
  FAudioBufferEntry *entry;
  uint32_t loopLength;
  uint32_t loopBegin;
  uint32_t playLength;
  uint32_t playBegin;
  uint32_t *adpcmByteCount;
  uint32_t adpcmMask;
  long local_50;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  do {
    if (*(int *)((long)in_RDI + 0xc) == 0) goto LAB_00128b33;
    iVar3 = SDL_ReportAssertion(&FAudioSourceVoice_SubmitSourceBuffer::sdl_assert_data,
                                "FAudioSourceVoice_SubmitSourceBuffer",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                ,0x996);
  } while (iVar3 == 0);
  if (iVar3 == 1) {
    pcVar1 = (code *)swi(3);
    uVar4 = (*pcVar1)();
    return uVar4;
  }
LAB_00128b33:
  local_34 = *(uint *)(in_RSI + 0x10);
  local_38 = *(uint *)(in_RSI + 0x14);
  local_3c = *(uint *)(in_RSI + 0x18);
  local_40 = *(uint *)(in_RSI + 0x1c);
  if ((*(int *)(in_RSI + 0x20) == 0) && ((local_3c != 0 || (local_40 != 0)))) {
    return 0x88960001;
  }
  if (local_38 == 0) {
    if (*(short *)in_RDI[0x1f] == 2) {
      local_38 = (*(uint *)(in_RSI + 4) / (uint)*(ushort *)(in_RDI[0x1f] + 0xc)) *
                 (uint)*(ushort *)(in_RDI[0x1f] + 0x12) - local_34;
    }
    else if (*(short *)in_RDI[0x1f] == 0x166) {
      local_38 = *(int *)(in_RDI[0x1f] + 0x18) - local_34;
    }
    else if (in_RDX == (long *)0x0) {
      local_38 = *(uint *)(in_RSI + 4) / (uint)*(ushort *)(in_RDI[0x1f] + 0xc) - local_34;
    }
    else {
      local_38 = (int)((ulong)*(uint *)(*in_RDX + (ulong)((int)in_RDX[1] - 1) * 4) /
                      ((long)(int)((uint)*(ushort *)(in_RDI[0x1f] + 2) *
                                  (uint)*(ushort *)(in_RDI[0x1f] + 0xe)) / 8 & 0xffffffffU)) -
                 local_34;
    }
  }
  if (((*(int *)(in_RSI + 0x20) != 0) && (in_RDX == (long *)0x0)) &&
     (*(short *)in_RDI[0x1f] != 0x166)) {
    if (local_34 + local_38 <= local_3c) {
      return 0x88960001;
    }
    if (local_40 == 0) {
      local_40 = (local_34 + local_38) - local_3c;
    }
    if ((7 < *(byte *)*in_RDI) &&
       ((local_3c + local_40 <= local_34 || (local_34 + local_38 < local_3c + local_40)))) {
      return 0x88960001;
    }
  }
  if (*(short *)in_RDI[0x1f] == 2) {
    uVar2 = (uint)*(ushort *)(in_RDI[0x1f] + 0x12);
    local_34 = local_34 - local_34 % uVar2;
    local_38 = local_38 - local_38 % uVar2;
    local_3c = local_3c - local_3c % uVar2;
    local_40 = local_40 - local_40 % uVar2;
    *(uint *)(in_RSI + 4) =
         (*(uint *)(in_RSI + 4) / (uint)*(ushort *)(in_RDI[0x1f] + 0xc)) *
         (uint)*(ushort *)(in_RDI[0x1f] + 0xc);
  }
  else if ((in_RDX != (long *)0x0) || (*(short *)in_RDI[0x1f] == 0x166)) {
    local_3c = 0;
    local_40 = local_34 + local_38;
  }
  lVar5 = (**(code **)(*in_RDI + 0xb8))(0x40);
  SDL_memcpy(lVar5,in_RSI,0x2c);
  *(uint *)(lVar5 + 0x10) = local_34;
  *(uint *)(lVar5 + 0x14) = local_38;
  *(uint *)(lVar5 + 0x18) = local_3c;
  *(uint *)(lVar5 + 0x1c) = local_40;
  if (in_RDX != (long *)0x0) {
    SDL_memcpy(lVar5 + 0x2c,in_RDX,0xc);
  }
  *(undefined8 *)(lVar5 + 0x38) = 0;
  if (((*(byte *)*in_RDI < 8) && (*(int *)(lVar5 + 0x20) != 0)) &&
     ((uint)(*(int *)(lVar5 + 0x18) + *(int *)(lVar5 + 0x1c)) <= *(uint *)(lVar5 + 0x10))) {
    *(undefined4 *)(lVar5 + 0x20) = 0;
  }
  FAudio_PlatformLockMutex((FAudioMutex)0x128f29);
  if (in_RDI[0x26] == 0) {
    in_RDI[0x26] = lVar5;
    *(undefined4 *)(in_RDI + 0x1e) = *(undefined4 *)(lVar5 + 0x10);
    *(undefined1 *)(in_RDI + 0x24) = 1;
  }
  else {
    for (local_50 = in_RDI[0x26]; *(long *)(local_50 + 0x38) != 0;
        local_50 = *(long *)(local_50 + 0x38)) {
    }
    *(long *)(local_50 + 0x38) = lVar5;
    do {
      if (local_50 != lVar5) goto LAB_00128ffb;
      iVar3 = SDL_ReportAssertion(&FAudioSourceVoice_SubmitSourceBuffer::sdl_assert_data_1,
                                  "FAudioSourceVoice_SubmitSourceBuffer",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                  ,0xa2f);
    } while (iVar3 == 0);
    if (iVar3 == 1) {
      pcVar1 = (code *)swi(3);
      uVar4 = (*pcVar1)();
      return uVar4;
    }
  }
LAB_00128ffb:
  FAudio_PlatformUnlockMutex((FAudioMutex)0x12900c);
  return 0;
}

Assistant:

uint32_t FAudioSourceVoice_SubmitSourceBuffer(
	FAudioSourceVoice *voice,
	const FAudioBuffer *pBuffer,
	const FAudioBufferWMA *pBufferWMA
) {
	uint32_t adpcmMask, *adpcmByteCount;
	uint32_t playBegin, playLength, loopBegin, loopLength;
	FAudioBufferEntry *entry, *list;

	LOG_API_ENTER(voice->audio)
	LOG_INFO(
		voice->audio,
		"%p: {Flags: 0x%x, AudioBytes: %u, pAudioData: %p, Play: %u + %u, Loop: %u + %u x %u}",
		(void*) voice,
		pBuffer->Flags,
		pBuffer->AudioBytes,
		(const void*) pBuffer->pAudioData,
		pBuffer->PlayBegin,
		pBuffer->PlayLength,
		pBuffer->LoopBegin,
		pBuffer->LoopLength,
		pBuffer->LoopCount
	)

	FAudio_assert(voice->type == FAUDIO_VOICE_SOURCE);
#ifdef HAVE_WMADEC
	FAudio_assert(	(voice->src.wmadec != NULL && (pBufferWMA != NULL ||
					(voice->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2 ||
					 voice->src.format->wFormatTag == FAUDIO_FORMAT_EXTENSIBLE))) ||
			(voice->src.wmadec == NULL && (pBufferWMA == NULL && voice->src.format->wFormatTag != FAUDIO_FORMAT_XMAUDIO2))	);
#endif /* HAVE_WMADEC */

	/* Start off with whatever they just sent us... */
	playBegin = pBuffer->PlayBegin;
	playLength = pBuffer->PlayLength;
	loopBegin = pBuffer->LoopBegin;
	loopLength = pBuffer->LoopLength;

	/* "LoopBegin/LoopLength must be zero if LoopCount is 0" */
	if (pBuffer->LoopCount == 0 && (loopBegin > 0 || loopLength > 0))
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	/* PlayLength Default */
	if (playLength == 0)
	{
		if (voice->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
		{
			FAudioADPCMWaveFormat *fmtex = (FAudioADPCMWaveFormat*) voice->src.format;
			playLength = (
				pBuffer->AudioBytes /
				fmtex->wfx.nBlockAlign *
				fmtex->wSamplesPerBlock
			) - playBegin;
		}
		else if (voice->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
		{
			FAudioXMA2WaveFormat *fmtex = (FAudioXMA2WaveFormat*) voice->src.format;
			playLength = fmtex->dwSamplesEncoded - playBegin;
		}
		else if (pBufferWMA != NULL)
		{
			playLength = (
				pBufferWMA->pDecodedPacketCumulativeBytes[pBufferWMA->PacketCount - 1] /
				(voice->src.format->nChannels * voice->src.format->wBitsPerSample / 8)
			) - playBegin;
		}
		else
		{
			playLength = (
				pBuffer->AudioBytes /
				voice->src.format->nBlockAlign
			) - playBegin;
		}
	}

	if (pBuffer->LoopCount > 0 && pBufferWMA == NULL && voice->src.format->wFormatTag != FAUDIO_FORMAT_XMAUDIO2)
	{
		/* "The value of LoopBegin must be less than PlayBegin + PlayLength" */
		if (loopBegin >= (playBegin + playLength))
		{
			LOG_API_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}

		/* LoopLength Default */
		if (loopLength == 0)
		{
			loopLength = playBegin + playLength - loopBegin;
		}

		/* "The value of LoopBegin + LoopLength must be greater than PlayBegin
		 * and less than PlayBegin + PlayLength"
		 */
		if (	voice->audio->version > 7 && (
			(loopBegin + loopLength) <= playBegin ||
			(loopBegin + loopLength) > (playBegin + playLength))	)
		{
			LOG_API_EXIT(voice->audio)
			return FAUDIO_E_INVALID_CALL;
		}
	}

	/* For ADPCM, round down to the nearest sample block size */
	if (voice->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		adpcmMask = ((FAudioADPCMWaveFormat*) voice->src.format)->wSamplesPerBlock;
		playBegin -= playBegin % adpcmMask;
		playLength -= playLength % adpcmMask;
		loopBegin -= loopBegin % adpcmMask;
		loopLength -= loopLength % adpcmMask;

		/* This is basically a const_cast... */
		adpcmByteCount = (uint32_t*) &pBuffer->AudioBytes;
		*adpcmByteCount = (
			pBuffer->AudioBytes / voice->src.format->nBlockAlign
		) * voice->src.format->nBlockAlign;
	}
	else if (pBufferWMA != NULL || voice->src.format->wFormatTag == FAUDIO_FORMAT_XMAUDIO2)
	{
		/* WMA only supports looping the whole buffer */
		loopBegin = 0;
		loopLength = playBegin + playLength;
	}

	/* Allocate, now that we have valid input */
	entry = (FAudioBufferEntry*) voice->audio->pMalloc(sizeof(FAudioBufferEntry));
	FAudio_memcpy(&entry->buffer, pBuffer, sizeof(FAudioBuffer));
	entry->buffer.PlayBegin = playBegin;
	entry->buffer.PlayLength = playLength;
	entry->buffer.LoopBegin = loopBegin;
	entry->buffer.LoopLength = loopLength;
	if (pBufferWMA != NULL)
	{
		FAudio_memcpy(&entry->bufferWMA, pBufferWMA, sizeof(FAudioBufferWMA));
	}
	entry->next = NULL;

	if (	voice->audio->version <= 7 && (
		entry->buffer.LoopCount > 0 &&
		entry->buffer.LoopBegin + entry->buffer.LoopLength <= entry->buffer.PlayBegin))
	{
		entry->buffer.LoopCount = 0;
	}

#ifdef FAUDIO_DUMP_VOICES
	/* dumping current buffer, append into "data" section */
	if (pBuffer->pAudioData != NULL && playLength > 0)
	{
		FAudio_DUMPVOICE_WriteBuffer(voice, pBuffer, pBufferWMA, playBegin, playLength);
	}
#endif /* FAUDIO_DUMP_VOICES */

	/* Submit! */
	FAudio_PlatformLockMutex(voice->src.bufferLock);
	LOG_MUTEX_LOCK(voice->audio, voice->src.bufferLock)
	if (voice->src.bufferList == NULL)
	{
		voice->src.bufferList = entry;
		voice->src.curBufferOffset = entry->buffer.PlayBegin;
		voice->src.newBuffer = 1;
	}
	else
	{
		list = voice->src.bufferList;
		while (list->next != NULL)
		{
			list = list->next;
		}
		list->next = entry;

		/* For some bizarre reason we get scenarios where a buffer is freed, only to
		 * have the allocator give us the exact same address and somehow get a single
		 * buffer referencing itself. I don't even know.
		 */
		FAudio_assert(list != entry);
	}
	LOG_INFO(
		voice->audio,
		"%p: appended buffer %p",
		(void*) voice,
		(void*) &entry->buffer
	)
	FAudio_PlatformUnlockMutex(voice->src.bufferLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->src.bufferLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}